

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

cmGeneratorTarget * __thiscall
cmGlobalGenerator::GetGeneratorTarget(cmGlobalGenerator *this,cmTarget *t)

{
  cmake *this_00;
  const_iterator cVar1;
  cmGeneratorTarget *pcVar2;
  string local_88;
  Snapshot local_68;
  cmTarget *local_50;
  cmListFileBacktrace local_48;
  
  local_50 = t;
  cVar1 = std::
          _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
          ::find(&(this->GeneratorTargets)._M_t,&local_50);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->GeneratorTargets)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = this->CMakeInstance;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Missing cmGeneratorTarget instance!","");
    cmState::Snapshot::Snapshot(&local_68,(cmState *)0x0,(PositionType)ZEXT816(0));
    local_48.Snapshot.Position.Position = local_68.Position.Position;
    local_48.Snapshot.State = local_68.State;
    local_48.Snapshot.Position.Tree = local_68.Position.Tree;
    local_48.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmake::IssueMessage(this_00,INTERNAL_ERROR,&local_88,&local_48);
    std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
              (&local_48.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (cmGeneratorTarget *)0x0;
  }
  else {
    pcVar2 = (cmGeneratorTarget *)cVar1._M_node[1]._M_parent;
  }
  return pcVar2;
}

Assistant:

cmGeneratorTarget*
cmGlobalGenerator::GetGeneratorTarget(cmTarget const* t) const
{
  cmGeneratorTargetsType::const_iterator ti = this->GeneratorTargets.find(t);
  if(ti == this->GeneratorTargets.end())
    {
    this->CMakeInstance->IssueMessage(
      cmake::INTERNAL_ERROR, "Missing cmGeneratorTarget instance!");
    return 0;
    }
  return ti->second;
}